

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint TTA::Flatten(void)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint k;
  ulong uVar4;
  
  puVar1 = rtable_;
  uVar2 = 1;
  for (uVar4 = 1; uVar4 < length_; uVar4 = uVar4 + 1) {
    if (uVar4 == puVar1[uVar4]) {
      uVar3 = uVar2 + 1;
      uVar2 = uVar3;
    }
    else {
      uVar3 = puVar1[puVar1[uVar4]];
    }
    puVar1[uVar4] = uVar3;
  }
  return uVar2;
}

Assistant:

static unsigned Flatten()
    {
        unsigned cur_label = 1;
        for (unsigned k = 1; k < length_; k++) {
            if (rtable_[k] == k) {
                cur_label++;
                rtable_[k] = cur_label;
            }
            else
                rtable_[k] = rtable_[rtable_[k]];
        }

        return cur_label;
    }